

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
kj::ArrayBuilder<capnp::_::(anonymous_namespace)::RpcConnectionState::Export>::~ArrayBuilder
          (ArrayBuilder<capnp::_::(anonymous_namespace)::RpcConnectionState::Export> *this)

{
  Export *pEVar1;
  RemoveConst<capnp::_::(anonymous_namespace)::RpcConnectionState::Export> *pRVar2;
  Export *pEVar3;
  
  pEVar1 = this->ptr;
  if (pEVar1 != (Export *)0x0) {
    pRVar2 = this->pos;
    pEVar3 = this->endPtr;
    this->ptr = (Export *)0x0;
    this->pos = (RemoveConst<capnp::_::(anonymous_namespace)::RpcConnectionState::Export> *)0x0;
    this->endPtr = (Export *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pEVar1,0x28,((long)pRVar2 - (long)pEVar1 >> 3) * -0x3333333333333333,
               ((long)pEVar3 - (long)pEVar1 >> 3) * -0x3333333333333333,
               ArrayDisposer::
               Dispose_<capnp::_::(anonymous_namespace)::RpcConnectionState::Export,_false>::
               destruct);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }